

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void mbedtls_debug_print_crt
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,
               mbedtls_x509_crt *crt)

{
  char local_648 [8];
  char buf [1024];
  char local_238 [4];
  int i;
  char str [512];
  mbedtls_x509_crt *crt_local;
  char *text_local;
  int line_local;
  char *file_local;
  int level_local;
  mbedtls_ssl_context *ssl_local;
  
  if ((((ssl->conf != (mbedtls_ssl_config *)0x0) &&
       (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
      (crt != (mbedtls_x509_crt *)0x0)) && (str._504_8_ = crt, level <= debug_threshold)) {
    for (; str._504_8_ != 0; str._504_8_ = *(undefined8 *)(str._504_8_ + 0x220)) {
      snprintf(local_238,0x200,"%s #%d:\n",text);
      debug_send_line(ssl,level,file,line,local_238);
      mbedtls_x509_crt_info
                (local_648,0x3ff,anon_var_dwarf_e09dc + 9,(mbedtls_x509_crt *)str._504_8_);
      debug_print_line_by_line(ssl,level,file,line,local_648);
      debug_print_pk(ssl,level,file,line,"crt->",(mbedtls_pk_context *)(str._504_8_ + 0x148));
    }
  }
  return;
}

Assistant:

void mbedtls_debug_print_crt( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line,
                      const char *text, const mbedtls_x509_crt *crt )
{
    char str[DEBUG_BUF_SIZE];
    int i = 0;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || crt == NULL || level > debug_threshold )
        return;

    while( crt != NULL )
    {
        char buf[1024];

        mbedtls_snprintf( str, sizeof( str ), "%s #%d:\n", text, ++i );
        debug_send_line( ssl, level, file, line, str );

        mbedtls_x509_crt_info( buf, sizeof( buf ) - 1, "", crt );
        debug_print_line_by_line( ssl, level, file, line, buf );

        debug_print_pk( ssl, level, file, line, "crt->", &crt->pk );

        crt = crt->next;
    }
}